

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cipher.cc
# Opt level: O2

void bssl::ssl_cipher_apply_rule
               (uint32_t cipher_id,CIPHER_ALIAS *alias,int rule,int strength_bits,bool in_group,
               CIPHER_ORDER **head_p,CIPHER_ORDER **tail_p)

{
  cipher_order_st *pcVar1;
  SSL_CIPHER *c;
  cipher_order_st *pcVar2;
  uint16_t uVar3;
  int iVar4;
  CIPHER_ORDER *pCVar5;
  uint uVar6;
  CIPHER_ORDER *pCVar7;
  undefined3 in_register_00000081;
  CIPHER_ORDER *pCVar8;
  CIPHER_ORDER *curr;
  CIPHER_ORDER *head;
  CIPHER_ORDER *local_60;
  cipher_order_st *local_58;
  uint16_t local_4a;
  CIPHER_ALIAS *local_48;
  uint local_40;
  undefined4 local_3c;
  CIPHER_ORDER **local_38;
  
  local_3c = CONCAT31(in_register_00000081,in_group);
  if (((strength_bits != -1 || cipher_id != 0) || (alias->min_version != 0)) ||
     ((alias->algorithm_mkey != 0 &&
      (((alias->algorithm_auth != 0 && (alias->algorithm_enc != 0)) && (alias->algorithm_mac != 0)))
      ))) {
    local_58 = *head_p;
    local_60 = *tail_p;
    pCVar8 = local_60;
    pcVar1 = local_58;
    if (rule == 3) {
      pCVar8 = local_58;
      pcVar1 = local_60;
    }
    pCVar5 = (CIPHER_ORDER *)0x0;
    local_48 = alias;
    local_38 = head_p;
LAB_0014c6bf:
    while ((curr = pcVar1, pCVar5 != pCVar8 && (curr != (CIPHER_ORDER *)0x0))) {
      pcVar1 = (&curr->next)[rule == 3];
      c = (SSL_CIPHER *)curr->cipher;
      pCVar5 = curr;
      if (cipher_id == 0) {
        if (strength_bits < 0) goto LAB_0014c7d2;
        iVar4 = SSL_CIPHER_get_bits(c,(int *)0x0);
        if (iVar4 == strength_bits) goto LAB_0014c70c;
      }
      else if ((uint32_t)c->id == cipher_id) goto LAB_0014c70c;
    }
    *local_38 = local_58;
    *tail_p = local_60;
  }
  return;
LAB_0014c7d2:
  if ((((((local_48->algorithm_mkey & *(uint *)((long)&c->id + 4)) != 0) &&
        ((local_48->algorithm_auth & (uint)c->algorithm_mkey) != 0)) &&
       ((uVar6 = *(uint *)((long)&c->algorithm_mkey + 4), (local_48->algorithm_enc & uVar6) != 0 &&
        ((local_48->algorithm_mac & (uint)c->algorithm_auth) != 0)))) &&
      ((local_48->min_version == 0 ||
       (local_4a = local_48->min_version, local_40 = uVar6,
       uVar3 = SSL_CIPHER_get_min_version((SSL_CIPHER *)c), uVar6 = local_40, uVar3 == local_4a))))
     && ((local_48->include_deprecated != false || ((uVar6 != 1 && ((int)c->id != 0x300c027)))))) {
LAB_0014c70c:
    if (rule == 4) {
      if (curr->active == true) {
        ll_append_tail(&local_58,curr,&local_60);
        curr->in_group = false;
      }
    }
    else if (rule == 1) {
      if (curr->active == false) {
        ll_append_tail(&local_58,curr,&local_60);
        curr->active = true;
        curr->in_group = SUB41(local_3c,0);
      }
    }
    else if (rule == 3) {
      if (curr->active == true) {
        if (local_58 != curr) {
          pCVar7 = curr->prev;
          if (local_60 == curr) {
            local_60 = pCVar7;
          }
          pcVar2 = curr->next;
          if (pcVar2 != (cipher_order_st *)0x0) {
            pcVar2->prev = pCVar7;
          }
          if (pCVar7 != (CIPHER_ORDER *)0x0) {
            pCVar7->next = pcVar2;
          }
          local_58->prev = curr;
          curr->next = local_58;
          curr->prev = (cipher_order_st *)0x0;
          local_58 = curr;
        }
        curr->active = false;
        curr->in_group = false;
      }
    }
    else if (rule == 2) {
      pcVar2 = curr->next;
      if (local_58 == curr) {
        pCVar7 = curr->prev;
        local_58 = pcVar2;
      }
      else {
        pCVar7 = curr->prev;
        pCVar7->next = pcVar2;
      }
      if (local_60 == curr) {
        local_60 = pCVar7;
      }
      curr->active = false;
      if (pcVar2 != (cipher_order_st *)0x0) {
        pcVar2->prev = pCVar7;
      }
      if (pCVar7 != (CIPHER_ORDER *)0x0) {
        pCVar7->next = pcVar2;
      }
      curr->next = (cipher_order_st *)0x0;
      curr->prev = (cipher_order_st *)0x0;
    }
  }
  goto LAB_0014c6bf;
}

Assistant:

static void ssl_cipher_apply_rule(uint32_t cipher_id, const CIPHER_ALIAS *alias,
                                  int rule, int strength_bits, bool in_group,
                                  CIPHER_ORDER **head_p,
                                  CIPHER_ORDER **tail_p) {
  CIPHER_ORDER *head, *tail, *curr, *next, *last;
  const SSL_CIPHER *cp;
  bool reverse = false;

  if (cipher_id == 0 && strength_bits == -1 && alias->min_version == 0 &&
      (alias->algorithm_mkey == 0 || alias->algorithm_auth == 0 ||
       alias->algorithm_enc == 0 || alias->algorithm_mac == 0)) {
    // The rule matches nothing, so bail early.
    return;
  }

  if (rule == CIPHER_DEL) {
    // needed to maintain sorting between currently deleted ciphers
    reverse = true;
  }

  head = *head_p;
  tail = *tail_p;

  if (reverse) {
    next = tail;
    last = head;
  } else {
    next = head;
    last = tail;
  }

  curr = NULL;
  for (;;) {
    if (curr == last) {
      break;
    }

    curr = next;
    if (curr == NULL) {
      break;
    }

    next = reverse ? curr->prev : curr->next;
    cp = curr->cipher;

    // Selection criteria is either a specific cipher, the value of
    // |strength_bits|, or the algorithms used.
    if (cipher_id != 0) {
      if (cipher_id != cp->id) {
        continue;
      }
    } else if (strength_bits >= 0) {
      if (strength_bits != SSL_CIPHER_get_bits(cp, NULL)) {
        continue;
      }
    } else {
      if (!(alias->algorithm_mkey & cp->algorithm_mkey) ||
          !(alias->algorithm_auth & cp->algorithm_auth) ||
          !(alias->algorithm_enc & cp->algorithm_enc) ||
          !(alias->algorithm_mac & cp->algorithm_mac) ||
          (alias->min_version != 0 &&
           SSL_CIPHER_get_min_version(cp) != alias->min_version) ||
          (!alias->include_deprecated && ssl_cipher_is_deprecated(cp))) {
        continue;
      }
    }

    // add the cipher if it has not been added yet.
    if (rule == CIPHER_ADD) {
      // reverse == false
      if (!curr->active) {
        ll_append_tail(&head, curr, &tail);
        curr->active = true;
        curr->in_group = in_group;
      }
    }

    // Move the added cipher to this location
    else if (rule == CIPHER_ORD) {
      // reverse == false
      if (curr->active) {
        ll_append_tail(&head, curr, &tail);
        curr->in_group = false;
      }
    } else if (rule == CIPHER_DEL) {
      // reverse == true
      if (curr->active) {
        // most recently deleted ciphersuites get best positions
        // for any future CIPHER_ADD (note that the CIPHER_DEL loop
        // works in reverse to maintain the order)
        ll_append_head(&head, curr, &tail);
        curr->active = false;
        curr->in_group = false;
      }
    } else if (rule == CIPHER_KILL) {
      // reverse == false
      if (head == curr) {
        head = curr->next;
      } else {
        curr->prev->next = curr->next;
      }

      if (tail == curr) {
        tail = curr->prev;
      }
      curr->active = false;
      if (curr->next != NULL) {
        curr->next->prev = curr->prev;
      }
      if (curr->prev != NULL) {
        curr->prev->next = curr->next;
      }
      curr->next = NULL;
      curr->prev = NULL;
    }
  }

  *head_p = head;
  *tail_p = tail;
}